

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::TransferDisposedObjects(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  HeapInfo *this_local;
  
  if ((this->hasPendingTransferDisposedObjects & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x618,"(this->hasPendingTransferDisposedObjects)",
                       "this->hasPendingTransferDisposedObjects");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  BVar3 = Recycler::IsConcurrentExecutingState(this->recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x61d,"(!this->recycler->IsConcurrentExecutingState())",
                       "!this->recycler->IsConcurrentExecutingState()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->hasPendingTransferDisposedObjects = false;
  for (local_14 = 0; local_14 < 0x30; local_14 = local_14 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::TransferDisposedObjects
              (this->heapBuckets + local_14);
  }
  for (local_18 = 0; local_18 < 0x1d; local_18 = local_18 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::TransferDisposedObjects
              (this->mediumHeapBuckets + local_18);
  }
  LargeHeapBucket::TransferDisposedObjects(&this->largeObjectBucket);
  return;
}

Assistant:

void
HeapInfo::TransferDisposedObjects()
{
    Assert(this->hasPendingTransferDisposedObjects);
#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    Assert(!this->recycler->IsConcurrentExecutingState() && !this->recycler->IsConcurrentSweepState());
#else
    Assert(!this->recycler->IsConcurrentExecutingState());
#endif
#endif
    this->hasPendingTransferDisposedObjects = false;

    // move the disposed object back to the free lists
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].TransferDisposedObjects();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].TransferDisposedObjects();
    }
#endif

    largeObjectBucket.TransferDisposedObjects();
}